

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

void __thiscall
wavingz::demod::state_machine::symbol_sm_t::symbol_sm_t
          (symbol_sm_t *this,function<void_(unsigned_char_*,_unsigned_char_*)> *callback)

{
  start_of_frame_1_t *this_00;
  function<void_(unsigned_char_*,_unsigned_char_*)> *callback_local;
  symbol_sm_t *this_local;
  
  std::function<void_(unsigned_char_*,_unsigned_char_*)>::function(&this->callback,callback);
  this_00 = (start_of_frame_1_t *)operator_new(0x10);
  memset(this_00,0,0x10);
  symbol_sm::start_of_frame_1_t::start_of_frame_1_t(this_00);
  std::
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
  ::unique_ptr<std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>,void>
            ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
              *)&this->current_state_m,(pointer)this_00);
  return;
}

Assistant:

symbol_sm_t(const std::function<void(uint8_t*, uint8_t*)>& callback)
      : callback(callback)
      , current_state_m(new symbol_sm::start_of_frame_1_t())
    {
    }